

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

void __thiscall QHostInfoLookupManager::abortLookup(QHostInfoLookupManager *this,int id)

{
  QMutex *pQVar1;
  long lVar2;
  __pointer_type pQVar3;
  long i;
  long lVar4;
  long lVar5;
  QHostInfoRunnable *pQVar6;
  qsizetype i_00;
  long lVar7;
  QList<QHostInfoRunnable_*> *this_00;
  long in_FS_OFFSET;
  bool bVar8;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar8 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar8) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar8) goto LAB_001af9aa;
  }
  else {
LAB_001af9aa:
    QBasicMutex::lockInternal();
  }
  if ((id == -1) || (this->wasDeleted != false)) goto LAB_001afab1;
  lVar5 = (this->postponedLookups).d.size;
  if (lVar5 != 0) {
    i_00 = 0;
    do {
      if ((this->postponedLookups).d.ptr[i_00]->id == id) {
        this_00 = &this->postponedLookups;
        goto LAB_001afa9b;
      }
      i_00 = i_00 + 1;
    } while (lVar5 != i_00);
  }
  lVar5 = (this->scheduledLookups).super_QList<QHostInfoRunnable_*>.d.size;
  if (lVar5 != 0) {
    i_00 = 0;
    do {
      if ((this->scheduledLookups).super_QList<QHostInfoRunnable_*>.d.ptr[i_00]->id == id) {
        this_00 = &(this->scheduledLookups).super_QList<QHostInfoRunnable_*>;
LAB_001afa9b:
        pQVar6 = QList<QHostInfoRunnable_*>::takeAt(this_00,i_00);
        if (pQVar6 != (QHostInfoRunnable *)0x0) {
          (**(code **)(*(long *)pQVar6 + 0x10))(pQVar6);
        }
        goto LAB_001afab1;
      }
      i_00 = i_00 + 1;
    } while (lVar5 != i_00);
  }
  i = (this->abortedLookups).d.size;
  if (i == 0) {
LAB_001afa61:
    lVar5 = -1;
  }
  else {
    lVar7 = -4;
    do {
      lVar2 = i * -4 + lVar7;
      if (lVar2 == -4) goto LAB_001afa5b;
      lVar5 = lVar7 + 4;
      lVar4 = lVar7 + 4;
      lVar7 = lVar5;
    } while (*(int *)((long)(this->abortedLookups).d.ptr + lVar4) != id);
    lVar5 = lVar5 >> 2;
LAB_001afa5b:
    if (lVar2 == -4) goto LAB_001afa61;
  }
  if (lVar5 == -1) {
    local_24 = id;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->abortedLookups,i,&local_24);
    QList<int>::end(&this->abortedLookups);
  }
LAB_001afab1:
  LOCK();
  pQVar3 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar3 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHostInfoLookupManager::abortLookup(int id)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return;

    if (id == -1)
        return;

#if QT_CONFIG(thread)
    // is postponed? delete and return
    for (int i = 0; i < postponedLookups.size(); i++) {
        if (postponedLookups.at(i)->id == id) {
            delete postponedLookups.takeAt(i);
            return;
        }
    }
#endif

    // is scheduled? delete and return
    for (int i = 0; i < scheduledLookups.size(); i++) {
        if (scheduledLookups.at(i)->id == id) {
            delete scheduledLookups.takeAt(i);
            return;
        }
    }

    if (!abortedLookups.contains(id))
        abortedLookups.append(id);
}